

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_memory_editor.h
# Opt level: O0

void __thiscall
MemoryEditor::DrawOptionsLine
          (MemoryEditor *this,Sizes *s,void *mem_data,size_t mem_size,size_t base_display_addr)

{
  undefined1 auVar1 [12];
  undefined1 auVar2 [12];
  bool bVar3;
  int iVar4;
  ulong uVar5;
  float fVar6;
  ImVec2 IVar7;
  float local_74;
  char *local_70;
  float fStack_5c;
  ImVec2 local_58;
  long local_50;
  size_t goto_addr;
  char *local_40;
  char *format_range;
  ImGuiStyle *style;
  size_t base_display_addr_local;
  size_t mem_size_local;
  void *mem_data_local;
  Sizes *s_local;
  MemoryEditor *this_local;
  
  style = (ImGuiStyle *)base_display_addr;
  base_display_addr_local = mem_size;
  mem_size_local = (size_t)mem_data;
  mem_data_local = s;
  s_local = (Sizes *)this;
  format_range = (char *)ImGui::GetStyle();
  if ((this->OptUpperCaseHex & 1U) == 0) {
    local_70 = "Range %0*zx..%0*zx";
  }
  else {
    local_70 = "Range %0*zX..%0*zX";
  }
  local_40 = local_70;
  ImVec2::ImVec2((ImVec2 *)&goto_addr,0.0,0.0);
  bVar3 = ImGui::Button("Options",(ImVec2 *)&goto_addr);
  if (bVar3) {
    ImGui::OpenPopup("context",0);
  }
  bVar3 = ImGui::BeginPopup("context",0);
  if (bVar3) {
    ImGui::SetNextItemWidth
              (*(float *)((long)mem_data_local + 8) * 7.0 + *(float *)(format_range + 0x3c) * 2.0);
    bVar3 = ImGui::DragInt("##cols",&this->Cols,0.2,4,0x20,"%d cols",0);
    if ((bVar3) && (this->ContentsWidthChanged = true, this->Cols < 1)) {
      this->Cols = 1;
    }
    ImGui::Checkbox("Show Data Preview",&this->OptShowDataPreview);
    ImGui::Checkbox("Show HexII",&this->OptShowHexII);
    bVar3 = ImGui::Checkbox("Show Ascii",&this->OptShowAscii);
    if (bVar3) {
      this->ContentsWidthChanged = true;
    }
    ImGui::Checkbox("Grey out zeroes",&this->OptGreyOutZeroes);
    ImGui::Checkbox("Uppercase Hex",&this->OptUpperCaseHex);
    ImGui::EndPopup();
  }
  ImGui::SameLine(0.0,-1.0);
  ImGui::Text(local_40,(ulong)*mem_data_local,style,(ulong)*mem_data_local,
              (long)style + (base_display_addr_local - 1));
  ImGui::SameLine(0.0,-1.0);
  ImGui::SetNextItemWidth
            ((float)(*mem_data_local + 1) * *(float *)((long)mem_data_local + 8) +
             *(float *)(format_range + 0x3c) * 2.0);
  bVar3 = ImGui::InputText("##addr",this->AddrInputBuf,0x20,0x22,(ImGuiInputTextCallback)0x0,
                           (void *)0x0);
  if ((bVar3) && (iVar4 = __isoc99_sscanf(this->AddrInputBuf,"%zX",&local_50), iVar4 == 1)) {
    this->GotoAddr = local_50 - (long)style;
    this->HighlightMax = 0xffffffffffffffff;
    this->HighlightMin = 0xffffffffffffffff;
  }
  if (this->GotoAddr != 0xffffffffffffffff) {
    if (this->GotoAddr < base_display_addr_local) {
      ImVec2::ImVec2(&local_58,0.0,0.0);
      ImGui::BeginChild("##scrolling",&local_58,false,0);
      IVar7 = ImGui::GetCursorStartPos();
      fStack_5c = IVar7.y;
      auVar1._8_4_ = 0;
      auVar1._0_8_ = (long)this->Cols;
      auVar2._8_4_ = 0;
      auVar2._0_8_ = this->GotoAddr;
      uVar5 = SUB128(auVar2 / auVar1,0);
      fVar6 = (float)((ulong)(SUB124(auVar2 / auVar1,0) & 1) | uVar5 >> 1);
      local_74 = fVar6 + fVar6;
      if (-1 < (long)uVar5) {
        local_74 = (float)(long)uVar5;
      }
      fVar6 = ImGui::GetTextLineHeight();
      ImGui::SetScrollFromPosY(local_74 * fVar6 + fStack_5c,0.5);
      ImGui::EndChild();
      this->DataPreviewAddr = this->GotoAddr;
      this->DataEditingAddr = this->GotoAddr;
      this->DataEditingTakeFocus = true;
    }
    this->GotoAddr = 0xffffffffffffffff;
  }
  return;
}

Assistant:

void DrawOptionsLine(const Sizes& s, void* mem_data, size_t mem_size, size_t base_display_addr)
    {
        IM_UNUSED(mem_data);
        ImGuiStyle& style = ImGui::GetStyle();
        const char* format_range = OptUpperCaseHex ? "Range %0*" _PRISizeT "X..%0*" _PRISizeT "X" : "Range %0*" _PRISizeT "x..%0*" _PRISizeT "x";

        // Options menu
        if (ImGui::Button("Options"))
            ImGui::OpenPopup("context");
        if (ImGui::BeginPopup("context"))
        {
            ImGui::SetNextItemWidth(s.GlyphWidth * 7 + style.FramePadding.x * 2.0f);
            if (ImGui::DragInt("##cols", &Cols, 0.2f, 4, 32, "%d cols")) { ContentsWidthChanged = true; if (Cols < 1) Cols = 1; }
            ImGui::Checkbox("Show Data Preview", &OptShowDataPreview);
            ImGui::Checkbox("Show HexII", &OptShowHexII);
            if (ImGui::Checkbox("Show Ascii", &OptShowAscii)) { ContentsWidthChanged = true; }
            ImGui::Checkbox("Grey out zeroes", &OptGreyOutZeroes);
            ImGui::Checkbox("Uppercase Hex", &OptUpperCaseHex);

            ImGui::EndPopup();
        }

        ImGui::SameLine();
        ImGui::Text(format_range, s.AddrDigitsCount, base_display_addr, s.AddrDigitsCount, base_display_addr + mem_size - 1);
        ImGui::SameLine();
        ImGui::SetNextItemWidth((s.AddrDigitsCount + 1) * s.GlyphWidth + style.FramePadding.x * 2.0f);
        if (ImGui::InputText("##addr", AddrInputBuf, IM_ARRAYSIZE(AddrInputBuf), ImGuiInputTextFlags_CharsHexadecimal | ImGuiInputTextFlags_EnterReturnsTrue))
        {
            size_t goto_addr;
            if (sscanf(AddrInputBuf, "%" _PRISizeT "X", &goto_addr) == 1)
            {
                GotoAddr = goto_addr - base_display_addr;
                HighlightMin = HighlightMax = (size_t)-1;
            }
        }

        if (GotoAddr != (size_t)-1)
        {
            if (GotoAddr < mem_size)
            {
                ImGui::BeginChild("##scrolling");
                ImGui::SetScrollFromPosY(ImGui::GetCursorStartPos().y + (GotoAddr / Cols) * ImGui::GetTextLineHeight());
                ImGui::EndChild();
                DataEditingAddr = DataPreviewAddr = GotoAddr;
                DataEditingTakeFocus = true;
            }
            GotoAddr = (size_t)-1;
        }
    }